

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O3

void __thiscall
DyndepParserTestUnsupportedVersion1_1::Run(DyndepParserTestUnsupportedVersion1_1 *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  string err;
  char kInput [28];
  DyndepParser parser;
  string local_148;
  string local_128;
  char local_108 [32];
  DyndepParser local_e8;
  
  builtin_strncpy(local_108 + 0x10,"sion = 1.1\n",0xc);
  builtin_strncpy(local_108,"ninja_dyndep_ver",0x10);
  DyndepParser::DyndepParser
            (&local_e8,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  sVar4 = strlen(local_108);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,local_108,local_108 + sVar4);
  bVar2 = DyndepParser::ParseTest(&local_e8,&local_148,&local_128);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x84,"parser.ParseTest(kInput, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_128);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x87,
             "\"input:1: unsupported \'ninja_dyndep_version = 1.1\'\\n\" \"ninja_dyndep_version = 1.1\\n\" \"                          ^ near here\" == err"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  local_e8.super_Parser._vptr_Parser = (_func_int **)&PTR_Parse_001fd9c0;
  local_e8.env_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001fda60;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_e8.env_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e8.env_.bindings_._M_t);
  return;
}

Assistant:

TEST_F(DyndepParserTest, UnsupportedVersion1_1) {
  const char kInput[] =
"ninja_dyndep_version = 1.1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unsupported 'ninja_dyndep_version = 1.1'\n"
            "ninja_dyndep_version = 1.1\n"
            "                          ^ near here", err);
}